

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

bool __thiscall senjo::GoCommandHandle::Parse(GoCommandHandle *this,char *params)

{
  int iVar1;
  char *pcVar2;
  Output *pOVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  Output local_58;
  Output local_50;
  Output local_48;
  bool local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  bool invalid;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21;
  char *local_20;
  char *params_local;
  GoCommandHandle *this_local;
  
  local_20 = params;
  params_local = (char *)this;
  if ((Parse(char_const*)::argBinc_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argBinc_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Parse(char_const*)::argBinc_abi_cxx11_,"binc",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argBinc_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&Parse(char_const*)::argBinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argBtime_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argBtime_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Parse(char_const*)::argBtime_abi_cxx11_,"btime",local_35)
    ;
    std::allocator<char>::~allocator((allocator<char> *)local_35);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argBtime_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argBtime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argDepth_abi_cxx11_,"depth",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argDepth_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argInfinite_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argInfinite_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argInfinite_abi_cxx11_,"infinite",(allocator *)&invalid
              );
    std::allocator<char>::~allocator((allocator<char> *)&invalid);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argInfinite_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argInfinite_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovestogo_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argMovestogo_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argMovestogo_abi_cxx11_,"movestogo",&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_38);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argMovestogo_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovestogo_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovetime_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argMovetime_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argMovetime_abi_cxx11_,"movetime",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argMovetime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovetime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNodes_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argNodes_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argNodes_abi_cxx11_,"nodes",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argNodes_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argNodes_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPonder_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argPonder_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argPonder_abi_cxx11_,"ponder",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argPonder_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argPonder_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSearchmoves_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argSearchmoves_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argSearchmoves_abi_cxx11_,"searchmoves",&local_3c);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argSearchmoves_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argSearchmoves_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWinc_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argWinc_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)Parse(char_const*)::argWinc_abi_cxx11_,"winc",&local_3d);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argWinc_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&Parse(char_const*)::argWinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWtime_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Parse(char_const*)::argWtime_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)Parse(char_const*)::argWtime_abi_cxx11_,"wtime",&local_3e);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    __cxa_atexit(std::__cxx11::string::~string,Parse(char_const*)::argWtime_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argWtime_abi_cxx11_);
  }
  this->infinite = false;
  this->ponder = false;
  this->depth = 0;
  this->movestogo = 0;
  this->binc = 0;
  this->btime = 0;
  this->movetime = 0;
  this->nodes = 0;
  this->winc = 0;
  this->wtime = 0;
  local_3f = false;
  while( true ) {
    bVar4 = false;
    if (((local_3f & 1U) == 0) && (bVar4 = false, local_20 != (char *)0x0)) {
      pcVar2 = NextWord(&local_20);
      bVar4 = *pcVar2 != '\0';
    }
    if (!bVar4) break;
    bVar4 = ParamMatch((string *)Parse(char_const*)::argSearchmoves_abi_cxx11_,&local_20);
    if (bVar4) {
      Output::Output(&local_48,InfoPrefix);
      Output::operator<<(&local_48,(char (*) [29])"searchmoves not implemented!");
      Output::~Output(&local_48);
      break;
    }
    bVar4 = HasParam((string *)Parse(char_const*)::argInfinite_abi_cxx11_,&this->infinite,&local_20)
    ;
    if ((((((!bVar4) &&
           (bVar4 = HasParam((string *)Parse(char_const*)::argPonder_abi_cxx11_,&this->ponder,
                             &local_20), !bVar4)) &&
          (bVar4 = NumberParam<int>((string *)Parse(char_const*)::argDepth_abi_cxx11_,&this->depth,
                                    &local_20,&local_3f), !bVar4)) &&
         ((bVar4 = NumberParam<int>((string *)Parse(char_const*)::argMovestogo_abi_cxx11_,
                                    &this->movestogo,&local_20,&local_3f), !bVar4 &&
          (bVar4 = NumberParam<unsigned_long>
                             ((string *)Parse(char_const*)::argBinc_abi_cxx11_,&this->binc,&local_20
                              ,&local_3f), !bVar4)))) &&
        ((bVar4 = NumberParam<unsigned_long>
                            ((string *)Parse(char_const*)::argBtime_abi_cxx11_,&this->btime,
                             &local_20,&local_3f), !bVar4 &&
         ((bVar4 = NumberParam<unsigned_long>
                             ((string *)Parse(char_const*)::argMovetime_abi_cxx11_,&this->movetime,
                              &local_20,&local_3f), !bVar4 &&
          (bVar4 = NumberParam<unsigned_long>
                             ((string *)Parse(char_const*)::argNodes_abi_cxx11_,&this->nodes,
                              &local_20,&local_3f), !bVar4)))))) &&
       ((bVar4 = NumberParam<unsigned_long>
                           ((string *)Parse(char_const*)::argWinc_abi_cxx11_,&this->winc,&local_20,
                            &local_3f), !bVar4 &&
        (bVar4 = NumberParam<unsigned_long>
                           ((string *)Parse(char_const*)::argWtime_abi_cxx11_,&this->wtime,&local_20
                            ,&local_3f), !bVar4)))) {
      Output::Output(&local_50,InfoPrefix);
      pOVar3 = Output::operator<<(&local_50,(char (*) [19])"Unexpected token: ");
      Output::operator<<(pOVar3,&local_20);
      Output::~Output(&local_50);
      return false;
    }
  }
  if ((local_3f & 1U) != 0) {
    Output::Output(&local_58,InfoPrefix);
    pOVar3 = Output::operator<<(&local_58,(char (*) [8])"usage: ");
    (*(this->super_BackgroundCommand)._vptr_BackgroundCommand[3])(local_78);
    Output::operator<<(pOVar3,local_78);
    std::__cxx11::string::~string((string *)local_78);
    Output::~Output(&local_58);
    return false;
  }
  if (((this->infinite & 1U) != 0) || ((this->ponder & 1U) != 0)) {
    this->depth = 0;
    this->movestogo = 0;
    this->binc = 0;
    this->btime = 0;
    this->movetime = 0;
    this->nodes = 0;
    this->winc = 0;
    this->wtime = 0;
  }
  return true;
}

Assistant:

bool GoCommandHandle::Parse(const char* params)
{
  static const std::string argBinc        = "binc";
  static const std::string argBtime       = "btime";
  static const std::string argDepth       = "depth";
  static const std::string argInfinite    = "infinite";
  static const std::string argMovestogo   = "movestogo";
  static const std::string argMovetime    = "movetime";
  static const std::string argNodes       = "nodes";
  static const std::string argPonder      = "ponder";
  static const std::string argSearchmoves = "searchmoves";
  static const std::string argWinc        = "winc";
  static const std::string argWtime       = "wtime";

  infinite  = false;
  ponder    = false;
  depth     = 0;
  movestogo = 0;
  binc      = 0;
  btime     = 0;
  movetime  = 0;
  nodes     = 0;
  winc      = 0;
  wtime     = 0;

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (ParamMatch(argSearchmoves, params)) {
      Output() << "searchmoves not implemented!"; // TODO
      break;
    }
    if (HasParam(argInfinite,     infinite,  params) ||
        HasParam(argPonder,       ponder,    params) ||
        NumberParam(argDepth,     depth,     params, invalid) ||
        NumberParam(argMovestogo, movestogo, params, invalid) ||
        NumberParam(argBinc,      binc,      params, invalid) ||
        NumberParam(argBtime,     btime,     params, invalid) ||
        NumberParam(argMovetime,  movetime,  params, invalid) ||
        NumberParam(argNodes,     nodes,     params, invalid) ||
        NumberParam(argWinc,      winc,      params, invalid) ||
        NumberParam(argWtime,     wtime,     params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (infinite || ponder) {
    depth     = 0;
    movestogo = 0;
    binc      = 0;
    btime     = 0;
    movetime  = 0;
    nodes     = 0;
    winc      = 0;
    wtime     = 0;
  }

  return true;
}